

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

uint64_t absl::lts_20240722::hash_internal::MixingHashState::CombineContiguousImpl
                   (ulong state,ulong *first,ulong len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint32_t uVar3;
  ulong uVar4;
  uint64_t uVar5;
  ulong uVar6;
  
  if (len < 0x11) {
    if (8 < len) {
      uVar6 = (*first << 0xb | *first >> 0x35) + state + 0x9ddfea08eb382d69;
      uVar4 = state + 0x9ddfea08eb382d69 ^ *(ulong *)((long)first + (len - 8));
      goto LAB_0010375e;
    }
    if (len < 4) {
      if (len == 0) {
        return state;
      }
      uVar3 = Read1To3((uchar *)first,len);
      uVar4 = (ulong)uVar3;
    }
    else {
      uVar4 = (ulong)*(uint *)((long)first + (len - 4)) << ((char)((int)len << 3) - 0x20U & 0x3f) |
              (ulong)(uint)*first;
    }
  }
  else {
    if (0x400 < len) {
      uVar5 = absl::lts_20240722::hash_internal::MixingHashState::CombineLargeContiguousImpl64
                        (state,(uchar *)first,len);
      return uVar5;
    }
    uVar4 = absl::lts_20240722::hash_internal::MixingHashState::LowLevelHashImpl((uchar *)first,len)
    ;
  }
  uVar4 = uVar4 + state;
  uVar6 = 0x9ddfea08eb382d69;
LAB_0010375e:
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar6;
  return SUB168(auVar1 * auVar2,8) ^ SUB168(auVar1 * auVar2,0);
}

Assistant:

inline uint64_t MixingHashState::CombineContiguousImpl(
    uint64_t state, const unsigned char* first, size_t len,
    std::integral_constant<int, 8> /* sizeof_size_t */) {
  // For large values we use LowLevelHash or CityHash depending on the platform,
  // for small ones we just use a multiplicative hash.
  uint64_t v;
  if (len > 16) {
    if (ABSL_PREDICT_FALSE(len > PiecewiseChunkSize())) {
      return CombineLargeContiguousImpl64(state, first, len);
    }
    v = Hash64(first, len);
  } else if (len > 8) {
    // This hash function was constructed by the ML-driven algorithm discovery
    // using reinforcement learning. We fed the agent lots of inputs from
    // microbenchmarks, SMHasher, low hamming distance from generated inputs and
    // picked up the one that was good on micro and macrobenchmarks.
    auto p = Read9To16(first, len);
    uint64_t lo = p.first;
    uint64_t hi = p.second;
    // Rotation by 53 was found to be most often useful when discovering these
    // hashing algorithms with ML techniques.
    lo = absl::rotr(lo, 53);
    state += kMul;
    lo += state;
    state ^= hi;
    uint128 m = state;
    m *= lo;
    return static_cast<uint64_t>(m ^ (m >> 64));
  } else if (len >= 4) {
    v = Read4To8(first, len);
  } else if (len > 0) {
    v = Read1To3(first, len);
  } else {
    // Empty ranges have no effect.
    return state;
  }
  return Mix(state, v);
}